

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O1

int run_test_timer(void)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  char *pcVar5;
  char *pcVar6;
  undefined8 in_R9;
  long lVar7;
  uv_timer_t never;
  uv_timer_t repeat;
  uv_timer_t once_timers [10];
  char acStack_738 [152];
  char local_6a0 [152];
  char local_608 [1520];
  
  pcVar6 = acStack_738;
  pcVar3 = acStack_738;
  pcVar2 = (char *)uv_default_loop();
  start_time = uv_now();
  if (start_time == 0) {
LAB_00176fe3:
    run_test_timer_cold_14();
LAB_00176fe8:
    run_test_timer_cold_3();
LAB_00176fed:
    run_test_timer_cold_4();
LAB_00176ff2:
    run_test_timer_cold_5();
LAB_00176ff7:
    pcVar3 = pcVar2;
    run_test_timer_cold_6();
LAB_00176ffc:
    run_test_timer_cold_7();
LAB_00177001:
    run_test_timer_cold_8();
LAB_00177006:
    run_test_timer_cold_9();
LAB_0017700b:
    run_test_timer_cold_10();
LAB_00177010:
    run_test_timer_cold_11();
  }
  else {
    pcVar5 = local_608;
    lVar7 = 0;
    do {
      pcVar2 = (char *)uv_default_loop();
      iVar1 = uv_timer_init(pcVar2,pcVar5);
      if (iVar1 != 0) {
LAB_00176fde:
        run_test_timer_cold_1();
        goto LAB_00176fe3;
      }
      pcVar2 = pcVar5;
      iVar1 = uv_timer_start(pcVar5,once_cb,lVar7,0);
      if (iVar1 != 0) {
        run_test_timer_cold_2();
        goto LAB_00176fde;
      }
      pcVar5 = pcVar5 + 0x98;
      lVar7 = lVar7 + 0x32;
    } while (lVar7 != 500);
    pcVar2 = (char *)uv_default_loop();
    iVar1 = uv_timer_init(pcVar2,local_6a0);
    if (iVar1 != 0) goto LAB_00176fe8;
    pcVar2 = local_6a0;
    iVar1 = uv_timer_start(pcVar2,repeat_cb,100,100);
    if (iVar1 != 0) goto LAB_00176fed;
    pcVar2 = (char *)uv_default_loop();
    iVar1 = uv_timer_init(pcVar2,acStack_738);
    if (iVar1 != 0) goto LAB_00176ff2;
    iVar1 = uv_timer_start(acStack_738,never_cb,100,100);
    pcVar2 = pcVar6;
    if (iVar1 != 0) goto LAB_00176ff7;
    iVar1 = uv_timer_stop();
    if (iVar1 != 0) goto LAB_00176ffc;
    uv_unref(acStack_738);
    pcVar3 = (char *)uv_default_loop();
    uv_run(pcVar3,0);
    if (once_cb_called != 10) goto LAB_00177001;
    if (once_close_cb_called != 10) goto LAB_00177006;
    pcVar3 = "repeat_cb_called %d\n";
    printf("repeat_cb_called %d\n",(ulong)(uint)repeat_cb_called);
    if (repeat_cb_called != 5) goto LAB_0017700b;
    if (repeat_close_cb_called != 1) goto LAB_00177010;
    pcVar3 = (char *)uv_default_loop();
    lVar7 = uv_now();
    if (499 < lVar7 - start_time) {
      uVar4 = uv_default_loop();
      uv_walk(uVar4,close_walk_cb,0);
      uv_run(uVar4,0);
      pcVar3 = (char *)uv_default_loop();
      iVar1 = uv_loop_close();
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0017701a;
    }
  }
  run_test_timer_cold_12();
LAB_0017701a:
  run_test_timer_cold_13();
  pcVar2 = "ONCE_CB %d\n";
  printf("ONCE_CB %d\n",(ulong)(uint)once_cb_called);
  if (pcVar3 == (char *)0x0) {
    once_cb_cold_2();
  }
  else {
    pcVar2 = pcVar3;
    iVar1 = uv_is_active();
    if (iVar1 == 0) {
      once_cb_called = once_cb_called + 1;
      uv_close(pcVar3,once_close_cb);
      uVar4 = uv_default_loop();
      iVar1 = uv_update_time(uVar4);
      return iVar1;
    }
  }
  once_cb_cold_1();
  puts("REPEAT_CB");
  if (pcVar2 == (char *)0x0) {
    repeat_cb_cold_2();
  }
  else {
    iVar1 = uv_is_active(pcVar2);
    if (iVar1 == 1) {
      repeat_cb_called = repeat_cb_called + 1;
      if (repeat_cb_called == 5) {
        iVar1 = uv_close(pcVar2,repeat_close_cb);
        return iVar1;
      }
      return repeat_cb_called;
    }
  }
  repeat_cb_cold_1();
  fprintf(_stderr,"Fatal error in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer.c"
          ,0x56,"never_cb should never be called",in_R9,pcVar2,pcVar3);
  fflush(_stderr);
  abort();
}

Assistant:

TEST_IMPL(timer) {
  uv_timer_t once_timers[10];
  uv_timer_t *once;
  uv_timer_t repeat, never;
  unsigned int i;
  int r;

  start_time = uv_now(uv_default_loop());
  ASSERT(0 < start_time);

  /* Let 10 timers time out in 500 ms total. */
  for (i = 0; i < ARRAY_SIZE(once_timers); i++) {
    once = once_timers + i;
    r = uv_timer_init(uv_default_loop(), once);
    ASSERT(r == 0);
    r = uv_timer_start(once, once_cb, i * 50, 0);
    ASSERT(r == 0);
  }

  /* The 11th timer is a repeating timer that runs 4 times */
  r = uv_timer_init(uv_default_loop(), &repeat);
  ASSERT(r == 0);
  r = uv_timer_start(&repeat, repeat_cb, 100, 100);
  ASSERT(r == 0);

  /* The 12th timer should not do anything. */
  r = uv_timer_init(uv_default_loop(), &never);
  ASSERT(r == 0);
  r = uv_timer_start(&never, never_cb, 100, 100);
  ASSERT(r == 0);
  r = uv_timer_stop(&never);
  ASSERT(r == 0);
  uv_unref((uv_handle_t*)&never);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(once_cb_called == 10);
  ASSERT(once_close_cb_called == 10);
  printf("repeat_cb_called %d\n", repeat_cb_called);
  ASSERT(repeat_cb_called == 5);
  ASSERT(repeat_close_cb_called == 1);

  ASSERT(500 <= uv_now(uv_default_loop()) - start_time);

  MAKE_VALGRIND_HAPPY();
  return 0;
}